

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minion.c
# Opt level: O3

int dlord(aligntyp atyp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000039;
  int iVar4;
  
  iVar4 = 0x14;
  do {
    uVar1 = mt_random();
    uVar1 = (uVar1 & 1) + 0x13b;
    if ((mvitals[uVar1].mvflags & 3) == 0) {
      iVar2 = sgn((int)*(char *)((long)mons[0].mattk + ((ulong)(uVar1 * 0x40) - 3)));
      iVar3 = sgn((int)CONCAT71(in_register_00000039,atyp));
      if (iVar2 == iVar3) {
        return uVar1;
      }
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  iVar4 = ndemon(&u.uz,atyp);
  return iVar4;
}

Assistant:

int dlord(aligntyp atyp)
{
	int tryct, pm;

	for (tryct = 0; tryct < 20; tryct++) {
	    pm = rn1(PM_YEENOGHU + 1 - PM_JUIBLEX, PM_JUIBLEX);
	    if (!(mvitals[pm].mvflags & G_GONE) &&
		    (atyp == A_NONE || sgn(mons[pm].maligntyp) == sgn(atyp)))
		return pm;
	}
	return ndemon(&u.uz, atyp);	/* approximate */
}